

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen.cpp
# Opt level: O2

void cppurses::detail::Screen::basic_paint(Widget *widg,Screen_descriptor *staged_tiles)

{
  __node_base *p_Var1;
  Glyph GStack_38;
  
  cover_leftovers(widg,staged_tiles);
  p_Var1 = &(staged_tiles->_M_h)._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    Glyph::Glyph(&GStack_38,(Glyph *)(p_Var1 + 3));
    basic_paint_single_point(widg,(Point *)(p_Var1 + 1),&GStack_38);
    if (GStack_38.brush.foreground_color_.initialized_ == true) {
      GStack_38.brush.foreground_color_.initialized_ = false;
    }
    if (GStack_38.brush.background_color_.initialized_ == true) {
      GStack_38.brush.background_color_.initialized_ = false;
    }
  }
  return;
}

Assistant:

void Screen::basic_paint(Widget& widg, const Screen_descriptor& staged_tiles)
{
    cover_leftovers(widg, staged_tiles);
    for (const auto& point_tile : staged_tiles) {
        basic_paint_single_point(widg, point_tile.first, point_tile.second);
    }
}